

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O0

int __thiscall sc_core::sc_plist_base::remove(sc_plist_base *this,char *__filename)

{
  void *pvVar1;
  void *d;
  size_t in_stack_ffffffffffffffb8;
  sc_plist_base *in_stack_ffffffffffffffe0;
  int local_8;
  
  if ((handle_t)__filename == this->head) {
    pvVar1 = pop_front(in_stack_ffffffffffffffe0);
    local_8 = (int)pvVar1;
  }
  else if ((handle_t)__filename == this->tail) {
    pvVar1 = pop_back(in_stack_ffffffffffffffe0);
    local_8 = (int)pvVar1;
  }
  else {
    local_8 = (int)*(undefined8 *)__filename;
    *(undefined8 *)(*(long *)(__filename + 8) + 0x10) = *(undefined8 *)(__filename + 0x10);
    *(undefined8 *)(*(long *)(__filename + 0x10) + 8) = *(undefined8 *)(__filename + 8);
    if (__filename != (char *)0x0) {
      sc_plist_elem::~sc_plist_elem((sc_plist_elem *)__filename);
      sc_plist_elem::operator_delete(__filename,in_stack_ffffffffffffffb8);
    }
  }
  return local_8;
}

Assistant:

void*
sc_plist_base::remove( handle_t h )
{
    if (h == head)
        return pop_front();
    else if (h == tail)
        return pop_back();
    else {
        void* d = h->data;
        h->prev->next = h->next;
        h->next->prev = h->prev;
        delete h;
        return d;
    }
}